

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_spawn.cpp
# Opt level: O0

void test9(void)

{
  ostream *poVar1;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int *in_stack_ffffffffffffff78;
  int local_7c;
  int local_5c;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar2;
  int *in_stack_ffffffffffffffc0;
  duration args_1;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar3;
  _func_void_int_int_ptr *in_stack_ffffffffffffffd0;
  duration f;
  int local_24;
  int local_c;
  
  t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  for (local_c = 0; local_c < nsize; local_c = local_c + 1) {
    depspawn::spawn<void(int,int&),int&,int&>
              (in_stack_ffffffffffffffd0,
               (int *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               in_stack_ffffffffffffffc0);
  }
  t1.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::wait_for_all();
  t2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  for (local_24 = 0; local_24 < nsize; local_24 = local_24 + 1) {
    if (mx[local_24][0] != nthreads + 1) {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_24);
      poVar1 = std::operator<<(poVar1," -> ");
      std::ostream::operator<<(poVar1,mx[local_24][0]);
      doerror();
    }
    mx[local_24][0] = 0;
  }
  pr((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  f.__r = (rep)t0.__d.__r;
  for (iVar3 = 0; iVar3 < nsize; iVar3 = iVar3 + 1) {
    depspawn::spawn<void(int,int&),int,int&>
              ((_func_void_int_int_ptr *)f.__r,(int *)CONCAT44(iVar3,in_stack_ffffffffffffffc8),
               in_stack_ffffffffffffffc0);
  }
  t1.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  args_1.__r = (rep)t1.__d.__r;
  depspawn::wait_for_all();
  t2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  for (iVar2 = 0; iVar2 < nsize; iVar2 = iVar2 + 1) {
    if (mx[iVar2][0] != nthreads + 1) {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar2);
      poVar1 = std::operator<<(poVar1," -> ");
      std::ostream::operator<<(poVar1,mx[iVar2][0]);
      doerror();
    }
    mx[iVar2][0] = 0;
  }
  pr((char *)CONCAT44(iVar2,in_stack_ffffffffffffffb0));
  t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  for (local_5c = 0; local_5c < nsize; local_5c = local_5c + 1) {
    depspawn::ignore<int&>(in_stack_ffffffffffffff78);
    depspawn::spawn<void(int,int&),depspawn::Ignore<int&>,int&>
              ((_func_void_int_int_ptr *)f.__r,
               (Ignore<int_&> *)CONCAT44(iVar3,in_stack_ffffffffffffffc8),(int *)args_1.__r);
  }
  t1.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::wait_for_all();
  t2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  for (local_7c = 0; local_7c < nsize; local_7c = local_7c + 1) {
    if (mx[local_7c][0] != nthreads + 1) {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,local_7c);
      poVar1 = std::operator<<(poVar1," -> ");
      std::ostream::operator<<(poVar1,mx[local_7c][0]);
      doerror();
    }
    mx[local_7c][0] = 0;
  }
  pr((char *)CONCAT44(iVar2,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void test9()
{
  
  //V1: just use it "as is"
  t0 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    spawn(depprev, nthreads, mx[i][0]);
  }
  
  t1 = std::chrono::high_resolution_clock::now();
  
  wait_for_all();
  
  t2 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    if(mx[i][0] != (nthreads + 1)) {
      std::cerr << i << " -> " << mx[i][0];
      doerror();
    }
    mx[i][0] = 0;
  }
  
  pr("f(const_var, diff_int&)");
  
  //V2: Freeze it
  t0 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    spawn(depprev, std::move(nthreads), mx[i][0]);
  }
  
  t1 = std::chrono::high_resolution_clock::now();
  
  wait_for_all();
  
  t2 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    if(mx[i][0] != (nthreads + 1)) {
      std::cerr << i << " -> " << mx[i][0];
      doerror();
    }
    mx[i][0] = 0;
  }
  
  pr("f(frozen const_var, diff_int&)");
  
  //V3: Ignore it
  t0 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    spawn(depprev, ignore(nthreads), mx[i][0]);
  }
  
  t1 = std::chrono::high_resolution_clock::now();
  
  wait_for_all();
  
  t2 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    if(mx[i][0] != (nthreads + 1)) {
      std::cerr << i << " -> " << mx[i][0];
      doerror();
    }
    mx[i][0] = 0;
  }
  
  pr("f(ignore(const_var), diff_int&)");
}